

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShowSpecsOf.hpp
# Opt level: O3

string * __thiscall
sciplot::ShowSpecsOf<sciplot::TicsSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,ShowSpecsOf<sciplot::TicsSpecs> *this)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = this->m_show;
  iVar2 = 0x18c142;
  if (bVar1 != false) {
    iVar2 = 0x17b425;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,iVar2,iVar2 + (bVar1 ^ 1) * 2);
  return __return_storage_ptr__;
}

Assistant:

auto ShowSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    return m_show ? "" : "no";
}